

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtBvhTriangleMeshShape.cpp
# Opt level: O2

void __thiscall
cbtBvhTriangleMeshShape::performRaycast::MyNodeOverlapCallback::processNode
          (MyNodeOverlapCallback *this,int nodeSubPart,int nodeTriangleIndex)

{
  float fVar1;
  undefined8 uVar2;
  cbtStridingMeshInterface *pcVar3;
  undefined1 auVar4 [16];
  int j;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  float fVar10;
  PHY_ScalarType indicestype;
  int stride;
  uchar *vertexbase;
  int numfaces;
  int indexstride;
  PHY_ScalarType type;
  int numverts;
  uchar *indexbase;
  cbtVector3 m_triangle [3];
  
  (*this->m_meshInterface->_vptr_cbtStridingMeshInterface[4])
            (this->m_meshInterface,&vertexbase,&numverts,&type,&stride,&indexbase,&indexstride,
             &numfaces,&indicestype,nodeSubPart);
  pcVar3 = this->m_meshInterface;
  uVar5 = 2;
  while (-1 < (int)uVar5) {
    uVar6 = (ulong)uVar5;
    if (indicestype == PHY_SHORT) {
      uVar7 = (uint)*(ushort *)(indexbase + uVar6 * 2 + (long)nodeTriangleIndex * (long)indexstride)
      ;
    }
    else {
      uVar7 = *(uint *)(indexbase + uVar6 * 4 + (long)nodeTriangleIndex * (long)indexstride);
    }
    lVar8 = (long)(int)uVar7 * (long)stride;
    if (type == PHY_FLOAT) {
      uVar2 = *(undefined8 *)(pcVar3->m_scaling).m_floats;
      auVar9._0_4_ = (float)*(undefined8 *)(vertexbase + lVar8) * (float)uVar2;
      auVar9._4_4_ = (float)((ulong)*(undefined8 *)(vertexbase + lVar8) >> 0x20) *
                     (float)((ulong)uVar2 >> 0x20);
      auVar9._8_8_ = 0;
      fVar10 = *(float *)(vertexbase + lVar8 + 8);
    }
    else {
      auVar4 = vcvtpd2ps_avx(*(undefined1 (*) [16])(vertexbase + lVar8));
      uVar2 = *(undefined8 *)(pcVar3->m_scaling).m_floats;
      auVar9._0_4_ = (float)uVar2 * auVar4._0_4_;
      auVar9._4_4_ = (float)((ulong)uVar2 >> 0x20) * auVar4._4_4_;
      auVar9._8_4_ = auVar4._8_4_ * 0.0;
      auVar9._12_4_ = auVar4._12_4_ * 0.0;
      fVar10 = (float)*(double *)(vertexbase + lVar8 + 0x10);
    }
    fVar1 = (pcVar3->m_scaling).m_floats[2];
    uVar5 = uVar5 - 1;
    uVar2 = vmovlps_avx(auVar9);
    *(undefined8 *)m_triangle[uVar6].m_floats = uVar2;
    m_triangle[uVar6].m_floats[2] = fVar10 * fVar1;
    m_triangle[uVar6].m_floats[3] = 0.0;
  }
  (*this->m_callback->_vptr_cbtTriangleCallback[2])
            (this->m_callback,m_triangle,nodeSubPart,(ulong)(uint)nodeTriangleIndex);
  (*this->m_meshInterface->_vptr_cbtStridingMeshInterface[6])(this->m_meshInterface,nodeSubPart);
  return;
}

Assistant:

virtual void processNode(int nodeSubPart, int nodeTriangleIndex)
		{
			cbtVector3 m_triangle[3];
			const unsigned char* vertexbase;
			int numverts;
			PHY_ScalarType type;
			int stride;
			const unsigned char* indexbase;
			int indexstride;
			int numfaces;
			PHY_ScalarType indicestype;

			m_meshInterface->getLockedReadOnlyVertexIndexBase(
				&vertexbase,
				numverts,
				type,
				stride,
				&indexbase,
				indexstride,
				numfaces,
				indicestype,
				nodeSubPart);

			unsigned int* gfxbase = (unsigned int*)(indexbase + nodeTriangleIndex * indexstride);
			cbtAssert(indicestype == PHY_INTEGER || indicestype == PHY_SHORT);

			const cbtVector3& meshScaling = m_meshInterface->getScaling();
			for (int j = 2; j >= 0; j--)
			{
				int graphicsindex = indicestype == PHY_SHORT ? ((unsigned short*)gfxbase)[j] : gfxbase[j];

				if (type == PHY_FLOAT)
				{
					float* graphicsbase = (float*)(vertexbase + graphicsindex * stride);

					m_triangle[j] = cbtVector3(graphicsbase[0] * meshScaling.getX(), graphicsbase[1] * meshScaling.getY(), graphicsbase[2] * meshScaling.getZ());
				}
				else
				{
					double* graphicsbase = (double*)(vertexbase + graphicsindex * stride);

					m_triangle[j] = cbtVector3(cbtScalar(graphicsbase[0]) * meshScaling.getX(), cbtScalar(graphicsbase[1]) * meshScaling.getY(), cbtScalar(graphicsbase[2]) * meshScaling.getZ());
				}
			}

			/* Perform ray vs. triangle collision here */
			m_callback->processTriangle(m_triangle, nodeSubPart, nodeTriangleIndex);
			m_meshInterface->unLockReadOnlyVertexBase(nodeSubPart);
		}